

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgLinearSolvers.cpp
# Opt level: O0

void __thiscall
TasGrid::TasSparse::WaveletBasisMatrix::apply<false>(WaveletBasisMatrix *this,double *x,double *r)

{
  double dVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  int local_34;
  double dStack_30;
  int j;
  double sum;
  int i;
  double *r_local;
  double *x_local;
  WaveletBasisMatrix *this_local;
  
  for (sum._4_4_ = 0; sum._4_4_ < this->num_rows; sum._4_4_ = sum._4_4_ + 1) {
    dStack_30 = 0.0;
    pvVar2 = ::std::vector<int,_std::allocator<int>_>::operator[](&this->pntr,(long)sum._4_4_);
    local_34 = *pvVar2;
    while( true ) {
      pvVar2 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->pntr,(long)(sum._4_4_ + 1));
      if (*pvVar2 <= local_34) break;
      pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->vals,(long)local_34);
      dVar1 = *pvVar3;
      pvVar2 = ::std::vector<int,_std::allocator<int>_>::operator[](&this->indx,(long)local_34);
      dStack_30 = dVar1 * x[*pvVar2] + dStack_30;
      local_34 = local_34 + 1;
    }
    r[sum._4_4_] = dStack_30;
  }
  return;
}

Assistant:

void WaveletBasisMatrix::apply(double const x[], double r[]) const{
    if (transpose){
        std::fill_n(r, num_rows, 0.0);
        for(int i=0; i<num_rows; i++){
            for(int j=pntr[i]; j<pntr[i+1]; j++)
                r[indx[j]] += vals[j] * x[i];
        }
    }else{
        for(int i=0; i<num_rows; i++){
            double sum = 0.0;
            for(int j=pntr[i]; j<pntr[i+1]; j++)
                sum += vals[j] * x[indx[j]];
            r[i] = sum;
        }
    }
}